

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_entry.hxx
# Opt level: O2

ptr<log_entry> __thiscall nuraft::log_entry::deserialize(log_entry *this,buffer *buf)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<log_entry> pVar1;
  log_val_type t;
  ptr<buffer> data;
  ulong term;
  EVP_PKEY_CTX local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  element_type *local_30;
  
  local_30 = (element_type *)buffer::get_ulong(buf);
  buffer::get_byte(buf);
  buffer::copy(local_40,(EVP_PKEY_CTX *)buf);
  std::
  make_shared<nuraft::log_entry,unsigned_long&,std::shared_ptr<nuraft::buffer>&,nuraft::log_val_type&>
            (&this->term_,(shared_ptr<nuraft::buffer> *)&local_30,(log_val_type *)local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  pVar1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  pVar1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (ptr<log_entry>)pVar1.super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static ptr<log_entry> deserialize(buffer& buf) {
        ulong term = buf.get_ulong();
        log_val_type t = static_cast<log_val_type>(buf.get_byte());
        ptr<buffer> data = buffer::copy(buf);
        return cs_new<log_entry>(term, data, t);
    }